

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O1

void ProcessEDSector(sector_t_conflict *sec,int recordnum)

{
  Node *pNVar1;
  short sVar2;
  uint uVar3;
  Node *pNVar4;
  long lVar5;
  byte bVar6;
  short sVar7;
  double *pdVar8;
  
  pNVar1 = EDSectors.Nodes + (EDSectors.Size - 1 & recordnum);
  while ((pNVar4 = pNVar1, pNVar4 != (Node *)0x0 && (pNVar4->Next != (Node *)0x1))) {
    pNVar1 = pNVar4->Next;
    if ((pNVar4->Pair).Key == recordnum) {
LAB_00383588:
      if (pNVar4 == (Node *)0x0) {
        Printf("EDF Sector record %d not found\n");
        return;
      }
      if ((pNVar4->Pair).Value.flagsSet == true) {
        sec->Flags = sec->Flags & 0x3fffff8e;
      }
      uVar3 = ~(pNVar4->Pair).Value.flagsRemove &
              ((pNVar4->Pair).Value.flags | sec->Flags | (pNVar4->Pair).Value.flagsAdd);
      sec->Flags = uVar3;
      if ((pNVar4->Pair).Value.damageflagsSet == true) {
        sec->Flags = uVar3 & 0xfffff87f;
        bVar6 = 0;
      }
      else {
        bVar6 = 2;
        if (sec->leakydamage < 0x100) {
          bVar6 = 4 < sec->leakydamage;
        }
      }
      sec->Flags = ~(pNVar4->Pair).Value.damageflagsRemove &
                   ((pNVar4->Pair).Value.damageflags | sec->Flags |
                   (pNVar4->Pair).Value.damageflagsAdd);
      bVar6 = ~(pNVar4->Pair).Value.leakyremove &
              (bVar6 | (pNVar4->Pair).Value.leaky | (pNVar4->Pair).Value.leakyadd);
      sVar7 = 0x100;
      if (bVar6 == 1) {
        sVar7 = 5;
      }
      sVar2 = 0;
      if (bVar6 != 0) {
        sVar2 = sVar7;
      }
      sec->leakydamage = sVar2;
      sec->damageamount = (pNVar4->Pair).Value.damageamount;
      sec->damageinterval = (short)(pNVar4->Pair).Value.damageinterval;
      (sec->damagetype).super_FName.Index = (pNVar4->Pair).Value.damagetype.super_FName.Index;
      sec->terrainnum[0] = (pNVar4->Pair).Value.floorterrain;
      sec->terrainnum[1] = (pNVar4->Pair).Value.ceilingterrain;
      if ((pNVar4->Pair).Value.colorSet == true) {
        uVar3 = (pNVar4->Pair).Value.color;
        sector_t::SetColor((sector_t *)sec,uVar3 >> 0x10 & 0xff,uVar3 >> 8 & 0xff,uVar3 & 0xff,0);
      }
      pdVar8 = &sec->planes[0].alpha;
      lVar5 = -4;
      do {
        (((splane *)(pdVar8 + -8))->xform).xOffs =
             *(double *)((long)(pNVar4->Pair).Value.xoffs + lVar5 * 2 + 8);
        pdVar8[-7] = *(double *)((long)(pNVar4->Pair).Value.yoffs + lVar5 * 2 + 8);
        ((DAngle *)(pdVar8 + -3))->Degrees =
             *(double *)((long)&(pNVar4->Pair).Value.angle[1].Degrees + lVar5 * 2);
        *pdVar8 = *(double *)((long)(pNVar4->Pair).Value.Overlayalpha + lVar5 * 2 + 8);
        *(uint *)(pdVar8 + -1) =
             *(uint *)(pdVar8 + -1) & 0xffffff83 |
             *(uint *)((long)(pNVar4->Pair).Value.portalflags + lVar5 + 4);
        pdVar8 = pdVar8 + 0xb;
        lVar5 = lVar5 + 4;
      } while (lVar5 == 0);
      return;
    }
  }
  pNVar4 = (Node *)0x0;
  goto LAB_00383588;
}

Assistant:

void ProcessEDSector(sector_t *sec, int recordnum)
{
	EDSector *esec = EDSectors.CheckKey(recordnum);
	if (esec == NULL)
	{
		Printf("EDF Sector record %d not found\n", recordnum);
		return;
	}

	// In ZDoom the regular and the damage flags are part of the same flag word so we need to do some masking.
	const DWORD flagmask = SECF_SECRET | SECF_WASSECRET | SECF_FRICTION | SECF_PUSH | SECF_SILENT | SECF_SILENTMOVE;
	if (esec->flagsSet) sec->Flags = (sec->Flags & ~flagmask);
	sec->Flags = (sec->Flags | esec->flags | esec->flagsAdd) & ~esec->flagsRemove;

	BYTE leak = 0;
	if (esec->damageflagsSet) sec->Flags = (sec->Flags & ~SECF_DAMAGEFLAGS);
	else leak = sec->leakydamage >= 256 ? 2 : sec->leakydamage >= 5 ? 1 : 0;
	sec->Flags = (sec->Flags | esec->damageflags | esec->damageflagsAdd) & ~esec->damageflagsRemove;
	leak = (leak | esec->leaky | esec->leakyadd) & ~esec->leakyremove;

	// the damage properties will be unconditionally overridden by Extradata.
	sec->leakydamage = leak == 0 ? 0 : leak == 1 ? 5 : 256;
	sec->damageamount = esec->damageamount;
	sec->damageinterval = esec->damageinterval;
	sec->damagetype = esec->damagetype;

	sec->terrainnum[sector_t::floor] = esec->floorterrain;
	sec->terrainnum[sector_t::ceiling] = esec->ceilingterrain;

	if (esec->colorSet) sec->SetColor(RPART(esec->color), GPART(esec->color), BPART(esec->color), 0);

	const DWORD pflagmask = PLANEF_DISABLED | PLANEF_NORENDER | PLANEF_NOPASS | PLANEF_BLOCKSOUND | PLANEF_ADDITIVE;
	for (int i = 0; i < 2; i++)
	{
		sec->SetXOffset(i, esec->xoffs[i]);
		sec->SetYOffset(i, esec->yoffs[i]);
		sec->SetAngle(i, esec->angle[i]);
		sec->SetAlpha(i, esec->Overlayalpha[i]);
		sec->planes[i].Flags = (sec->planes[i].Flags & ~pflagmask) | esec->portalflags[i];
	}
}